

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
          (SmallVectorTemplateBase<llvm::StringRef,_true> *this,StringRef *Elt)

{
  undefined8 *puVar1;
  uint uVar2;
  size_t sVar3;
  
  if ((this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Capacity
      <= (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Size)
  {
    SmallVectorTemplateBase<llvm::StringRef,true>::push_back(this);
  }
  sVar3 = Elt->Length;
  puVar1 = (undefined8 *)
           ((long)(this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).
                  super_SmallVectorBase.BeginX +
           (ulong)(this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).
                  super_SmallVectorBase.Size * 0x10);
  *puVar1 = Elt->Data;
  puVar1[1] = sVar3;
  uVar2 = (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Size;
  if (uVar2 < (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.
              Capacity) {
    (this->super_SmallVectorTemplateCommon<llvm::StringRef,_void>).super_SmallVectorBase.Size =
         uVar2 + 1;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(reinterpret_cast<void *>(this->end()), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }